

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_val_t FromWabtValue(Store *store,TypedValue *tv)

{
  Enum EVar1;
  Ref ref;
  FILE *__stream;
  wasm_valkind_t wVar2;
  ValueType type;
  undefined7 extraout_var;
  wasm_func_t *this;
  TypedValue *in_RDX;
  undefined7 uVar4;
  ulong uVar3;
  ulong uVar5;
  wasm_val_t wVar6;
  RefPtr<wabt::interp::Foreign> local_88;
  RefPtr<wabt::interp::Func> local_68;
  string local_50;
  
  __stream = _stderr;
  wabt::interp::TypedValueToString_abi_cxx11_(&local_50,(interp *)tv,in_RDX);
  fprintf(__stream,"CAPI: [%s] %s\n","FromWabtValue",local_50._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  EVar1 = (tv->type).enum_;
  uVar4 = (undefined7)((ulong)tv >> 8);
  switch(EVar1) {
  case Any:
  case ~I64:
switchD_00129013_caseD_0:
    fprintf(_stderr,"CAPI: [%s] unexpected wabt type: %d\n","FromWabtValue");
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc"
                  ,0x1ce,"wasm_val_t FromWabtValue(Store &, const TypedValue &)");
  case Hostref:
    goto switchD_00129013_caseD_2;
  case F64:
    this = (wasm_func_t *)(tv->value).i64_;
    uVar5 = (ulong)this & 0xffffffff00000000;
    uVar3 = CONCAT71(uVar4,3);
    goto LAB_00129151;
  case F32:
    this = (wasm_func_t *)(ulong)(tv->value).i32_;
    uVar3 = CONCAT71(uVar4,2);
    break;
  case I64:
    this = (wasm_func_t *)(tv->value).i64_;
    uVar5 = (ulong)this & 0xffffffff00000000;
    uVar3 = CONCAT71(uVar4,1);
    goto LAB_00129151;
  case I32:
    this = (wasm_func_t *)(ulong)(tv->value).i32_;
    uVar3 = 0;
    break;
  default:
    if (2 < (uint)(EVar1 + 0x12)) goto switchD_00129013_caseD_0;
switchD_00129013_caseD_2:
    ref.index = (tv->value).ref_.index;
    type = wabt::interp::Store::GetValueType(store,ref);
    wVar2 = FromWabtValueType(type);
    uVar3 = CONCAT71(extraout_var,wVar2) & 0xffffffff;
    if (type.enum_ != Nullref) {
      if (type.enum_ == Hostref) {
        this = (wasm_func_t *)operator_new(0x18);
        wabt::interp::RefPtr<wabt::interp::Foreign>::RefPtr(&local_88,store,ref);
        wasm_foreign_t::wasm_foreign_t((wasm_foreign_t *)this,&local_88);
        uVar5 = (ulong)this & 0xffffffff00000000;
        if (local_88.obj_ != (Foreign *)0x0) {
          wabt::interp::Store::DeleteRoot(local_88.store_,local_88.root_index_);
        }
      }
      else {
        if (type.enum_ != Funcref) {
          abort();
        }
        this = (wasm_func_t *)operator_new(0x18);
        wabt::interp::RefPtr<wabt::interp::Func>::RefPtr(&local_68,store,ref);
        wasm_func_t::wasm_func_t(this,&local_68);
        uVar5 = (ulong)this & 0xffffffff00000000;
        if (local_68.obj_ != (Func *)0x0) {
          wabt::interp::Store::DeleteRoot(local_68.store_,local_68.root_index_);
        }
      }
      goto LAB_00129151;
    }
    this = (wasm_func_t *)0x0;
  }
  uVar5 = 0;
LAB_00129151:
  wVar6.of.i64 = (ulong)this & 0xffffffff | uVar5;
  wVar6._0_8_ = uVar3 & 0xffffffff;
  return wVar6;
}

Assistant:

static wasm_val_t FromWabtValue(Store& store, const TypedValue& tv) {
  TRACE("%s", TypedValueToString(tv).c_str());
  wasm_val_t out_value;
  switch (tv.type) {
    case Type::I32:
      out_value.kind = WASM_I32;
      out_value.of.i32 = tv.value.Get<s32>();
      break;
    case Type::I64:
      out_value.kind = WASM_I64;
      out_value.of.i64 = tv.value.Get<s64>();
      break;
    case Type::F32:
      out_value.kind = WASM_F32;
      out_value.of.f32 = tv.value.Get<f32>();
      break;
    case Type::F64:
      out_value.kind = WASM_F64;
      out_value.of.f64 = tv.value.Get<f64>();
      break;
    case Type::Anyref:
    case Type::Funcref:
    case Type::Hostref:
    case Type::Nullref: {
      Ref ref = tv.value.Get<Ref>();
      // Get the actual type for this reference; tv.type uses the function
      // signature, which may be to general (e.g. anyref).
      Type type = store.GetValueType(ref);
      out_value.kind = FromWabtValueType(type);
      switch (type) {
        case Type::Funcref:
          out_value.of.ref = new wasm_func_t(store.UnsafeGet<Func>(ref));
          break;

        case Type::Hostref:
          out_value.of.ref = new wasm_foreign_t(store.UnsafeGet<Foreign>(ref));
          break;

        case Type::Nullref:
          out_value.of.ref = nullptr;
          break;

        default: WABT_UNREACHABLE;
      }
      break;
    }
    default:
      TRACE("unexpected wabt type: %d", static_cast<int>(tv.type));
      assert(false);
  }
  return out_value;
}